

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lock.c
# Opt level: O3

int doclose(int dx,int dy,int dz)

{
  char cVar1;
  monst *mtmp;
  level *plVar2;
  boolean bVar3;
  schar sVar4;
  schar sVar5;
  schar sVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  undefined8 in_RAX;
  byte bVar10;
  byte bVar11;
  char *pcVar12;
  coord cc;
  schar unused;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  if (((youmonst.data)->mflags1 & 0x2000) == 0) {
    if ((u.utrap == 0) || (u.utraptype != 1)) {
      if (dz == -2 || (dy == -2 || dx == -2)) {
LAB_001b7445:
        iVar7 = get_adjacent_loc((char *)0x0,(char *)0x0,u.ux,u.uy,(coord *)((long)&uStack_38 + 5),
                                 (schar *)((long)&uStack_38 + 7));
        if (iVar7 == 0) {
          return 0;
        }
        dx = (uint)uStack_38._5_1_ - (uint)(byte)u.ux;
        dy = (uint)uStack_38._6_1_ - (uint)(byte)u.uy;
        bVar11 = uStack_38._6_1_;
        bVar10 = uStack_38._5_1_;
      }
      else {
        bVar10 = u.ux + (char)dx;
        bVar11 = u.uy + (char)dy;
        uStack_38._7_1_ = (undefined1)((ulong)in_RAX >> 0x38);
        uStack_38._0_7_ = CONCAT16(bVar11,CONCAT15(bVar10,(int5)in_RAX));
        if (0x14 < bVar11 || (byte)(bVar10 + 0xb0) < 0xb1) goto LAB_001b7445;
      }
      plVar2 = level;
      if ((bVar10 == u.ux) && (bVar11 == u.uy)) {
        pline("You are in the way!");
        return 1;
      }
      mtmp = level->monsters[(char)bVar10][(char)bVar11];
      if (((((mtmp != (monst *)0x0) && ((mtmp->field_0x61 & 2) == 0)) && (mtmp->m_ap_type == '\x01')
           ) && ((mtmp->mappearance == 0x1c || (mtmp->mappearance == 0x1b)))) &&
         ((u.uprops[0x17].intrinsic == 0 && (u.uprops[0x17].extrinsic == 0)))) {
        stumble_onto_mimic(mtmp,(schar)dx,(schar)dy);
        return 1;
      }
      cVar1 = level->locations[(char)bVar10][(char)bVar11].typ;
      if (cVar1 == '\x17') {
        if ((*(ushort *)&level->locations[(char)bVar10][(char)bVar11].field_0x6 & 0x1f0) == 0) {
          pcVar12 = "This doorway has no door.";
        }
        else {
          bVar3 = obstructed((int)(char)bVar10,(int)(char)bVar11);
          if (bVar3 != '\0') {
            return 0;
          }
          uVar9 = *(uint *)&plVar2->locations[(char)bVar10][(char)bVar11].field_0x6;
          uVar8 = uVar9 >> 4 & 0x1f;
          if (uVar8 == 1) {
            pcVar12 = "This door is broken.";
          }
          else if ((uVar9 & 0xc0) == 0) {
            if (uVar8 != 2) {
              return 1;
            }
            if (u.usteed != (monst *)0x0 || (youmonst.data)->msize != '\0') {
              if (u.usteed == (monst *)0x0) {
                uVar9 = mt_random();
                sVar4 = acurrstr();
                sVar5 = acurr(3);
                sVar6 = acurr(4);
                if ((int)((short)((short)sVar6 + (short)sVar5 + (short)sVar4) / 3) <=
                    (int)(uVar9 % 0x19)) {
                  iVar7 = 1;
                  exercise(0,'\x01');
                  pcVar12 = "The door resists!";
                  goto LAB_001b73e3;
                }
              }
              pline("The door closes.");
              *(uint *)&plVar2->locations[(char)bVar10][(char)bVar11].field_0x6 =
                   *(uint *)&plVar2->locations[(char)bVar10][(char)bVar11].field_0x6 & 0xfffffe0e |
                   0x41;
              map_background(uStack_38._5_1_,uStack_38._6_1_,1);
              if (u.uprops[0x1e].intrinsic == 0) {
                if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001b76f5;
                if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001b76f0;
LAB_001b772f:
                newsym((int)(char)uStack_38._5_1_,(int)(char)uStack_38._6_1_);
              }
              else {
LAB_001b76f0:
                if (ublindf != (obj *)0x0) {
LAB_001b76f5:
                  if (ublindf->oartifact == '\x1d') goto LAB_001b772f;
                }
                feel_location(uStack_38._5_1_,uStack_38._6_1_);
              }
              block_point((int)(char)uStack_38._5_1_,(int)(char)uStack_38._6_1_);
              return 1;
            }
            pcVar12 = "You\'re too small to push the door closed.";
          }
          else {
            pcVar12 = "This door is already closed.";
          }
        }
      }
      else {
        if (cVar1 != '$') {
          if (u.uprops[0x1e].intrinsic == 0) {
            if ((ublindf == (obj *)0x0) || (ublindf->otyp == 0xed)) {
              if (((youmonst.data)->mflags1 & 0x1000) == 0) {
                pcVar12 = "see";
                goto LAB_001b75d9;
              }
              goto LAB_001b7589;
            }
          }
          else {
LAB_001b7589:
            if (ublindf == (obj *)0x0) {
              pcVar12 = "feel";
              goto LAB_001b75d9;
            }
          }
          pcVar12 = "feel";
          if (ublindf->oartifact == '\x1d') {
            pcVar12 = "see";
          }
LAB_001b75d9:
          pline("You %s no door there.",pcVar12);
          return 0;
        }
        pcVar12 = "There is no obvious way to close the drawbridge.";
      }
    }
    else {
      pcVar12 = "You can\'t reach over the edge of the pit.";
    }
  }
  else {
    pcVar12 = "You can\'t close anything -- you have no hands!";
  }
  iVar7 = 0;
LAB_001b73e3:
  pline(pcVar12);
  return iVar7;
}

Assistant:

int doclose(int dx, int dy, int dz)
{
        boolean got_dir = FALSE;
	struct rm *door;
	struct monst *mtmp;
        coord cc;
        schar unused;

	if (nohands(youmonst.data)) {
	    pline("You can't close anything -- you have no hands!");
	    return 0;
	}

	if (u.utrap && u.utraptype == TT_PIT) {
	    pline("You can't reach over the edge of the pit.");
	    return 0;
	}

	if (dx != -2 && dy != -2 && dz != -2) { /* -2 signals no direction given  */
	    cc.x = u.ux + dx;
	    cc.y = u.uy + dy;
	    if (isok(cc.x, cc.y))
		got_dir = TRUE;
	}

	if (!got_dir && !get_adjacent_loc(NULL, NULL, u.ux, u.uy, &cc, &unused))
	    return 0;

        if (!got_dir) {
          dx = cc.x-u.ux;
          dy = cc.y-u.uy;
          dz = 0;
        }

	if ((cc.x == u.ux) && (cc.y == u.uy)) {
		pline("You are in the way!");
		return 1;
	}

	if ((mtmp = m_at(level, cc.x, cc.y))		&&
		mtmp->m_ap_type == M_AP_FURNITURE	&&
		(mtmp->mappearance == S_hcdoor ||
			mtmp->mappearance == S_vcdoor)	&&
		!Protection_from_shape_changers)	 {

	    stumble_onto_mimic(mtmp, dx, dy);
	    return 1;
	}

	door = &level->locations[cc.x][cc.y];

	if (!IS_DOOR(door->typ)) {
		if (door->typ == DRAWBRIDGE_DOWN)
		    pline("There is no obvious way to close the drawbridge.");
		else
		    pline("You %s no door there.",
				Blind ? "feel" : "see");
		return 0;
	}

	if (door->doormask == D_NODOOR) {
	    pline("This doorway has no door.");
	    return 0;
	}

	if (obstructed(cc.x, cc.y)) return 0;

	if (door->doormask == D_BROKEN) {
	    pline("This door is broken.");
	    return 0;
	}

	if (door->doormask & (D_CLOSED | D_LOCKED)) {
	    pline("This door is already closed.");
	    return 0;
	}

	if (door->doormask == D_ISOPEN) {
	    if (verysmall(youmonst.data) && !u.usteed) {
		 pline("You're too small to push the door closed.");
		 return 0;
	    }
	    if (u.usteed ||
		rn2(25) < (ACURRSTR+ACURR(A_DEX)+ACURR(A_CON))/3) {
		pline("The door closes.");
		door->doormask = D_CLOSED;
		door->mem_door_l = 1;
		/*
		 * map_background() here sets the mem_door flags correctly;
		 * and it's redundant to both feel_location() and newsym()
		 * with a door.
		 *
		 * Exception: if we remember an invisible monster on the
		 * door square, but in this case, we want to set the
		 * memory of a door there anyway because we know there's a
		 * door there because we just closed it, and with layered
		 * memory this doesn't clash with keeping the I there.
		 */
		map_background(cc.x, cc.y, TRUE);
		if (Blind)
		    feel_location(cc.x,cc.y);	/* the hero knows she closed it */
		else
		    newsym(cc.x,cc.y);
		block_point(cc.x,cc.y);	/* vision:  no longer see there */
	    }
	    else {
	        exercise(A_STR, TRUE);
	        pline("The door resists!");
	    }
	}

	return 1;
}